

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

bool __thiscall
clickhouse::Client::Impl::ReceiveData(Impl *this,function<void_(const_clickhouse::Block_&)> *cb)

{
  bool bVar1;
  CodedInputStream *in_RSI;
  CompressedInput *in_RDI;
  CodedInputStream *in_stack_00000008;
  Block *in_stack_00000010;
  Impl *in_stack_00000018;
  CodedInputStream coded;
  CompressedInput compressed;
  string table_name;
  Block block;
  Block *in_stack_ffffffffffffff18;
  undefined6 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 in_stack_ffffffffffffff27;
  CodedInputStream local_b8;
  ZeroCopyInput local_b0 [8];
  uint local_70;
  string local_60 [95];
  byte local_1;
  
  Block::Block((Block *)CONCAT17(in_stack_ffffffffffffff27,
                                 CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
  std::__cxx11::string::string(local_60);
  bVar1 = WireFormat::ReadString
                    (in_RSI,(string *)
                            CONCAT17(in_stack_ffffffffffffff27,
                                     CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)))
  ;
  if (bVar1) {
    if (*(int *)&in_RDI[3].data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start == 1) {
      CompressedInput::CompressedInput
                ((CompressedInput *)
                 CONCAT17(in_stack_ffffffffffffff27,
                          CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)),
                 (CodedInputStream *)in_stack_ffffffffffffff18);
      CodedInputStream::CodedInputStream(&local_b8,local_b0);
      in_stack_ffffffffffffff27 = ReadBlock(in_stack_00000018,in_stack_00000010,in_stack_00000008);
      if (!(bool)in_stack_ffffffffffffff27) {
        local_1 = 0;
      }
      local_70 = (uint)!(bool)in_stack_ffffffffffffff27;
      CompressedInput::~CompressedInput(in_RDI);
      if (local_70 != 0) goto LAB_0024df43;
    }
    else {
      in_stack_ffffffffffffff26 = ReadBlock(in_stack_00000018,in_stack_00000010,in_stack_00000008);
      if (!(bool)in_stack_ffffffffffffff26) {
        local_1 = 0;
        local_70 = 1;
        goto LAB_0024df43;
      }
    }
    std::function<void_(const_clickhouse::Block_&)>::operator()
              ((function<void_(const_clickhouse::Block_&)> *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)),
               in_stack_ffffffffffffff18);
    local_1 = 1;
    local_70 = 1;
  }
  else {
    local_1 = 0;
    local_70 = 1;
  }
LAB_0024df43:
  std::__cxx11::string::~string(local_60);
  Block::~Block((Block *)0x24df5d);
  return (bool)(local_1 & 1);
}

Assistant:

bool Client::Impl::ReceiveData(std::function<void(const Block&)> cb) {
    Block block;
    std::string table_name;

    // Read name of a table.
    if (!WireFormat::ReadString(&input_, &table_name)) {
        return false;
    }

    if (compression_ == CompressionState::Enable) {
        CompressedInput compressed(&input_);
        CodedInputStream coded(&compressed);

        if (!ReadBlock(&block, &coded)) {
            return false;
        }
    } else {
        if (!ReadBlock(&block, &input_)) {
            return false;
        }
    }

    cb(block);

    return true;
}